

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamReadGroupDictionary.cpp
# Opt level: O0

void __thiscall
BamTools::SamReadGroupDictionary::Add
          (SamReadGroupDictionary *this,SamReadGroupDictionary *readGroups)

{
  bool bVar1;
  SamReadGroupConstIterator readGroup;
  SamReadGroupConstIterator __lhs;
  SamReadGroupDictionary *in_RSI;
  SamReadGroupDictionary *in_RDI;
  SamReadGroupConstIterator rgEnd;
  SamReadGroupConstIterator rgIter;
  
  readGroup = ConstBegin(in_RDI);
  __lhs = ConstEnd(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
                        *)__lhs._M_current,
                       (__normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
    ::operator*((__normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
                 *)&stack0xffffffffffffffe8);
    Add(in_RSI,readGroup._M_current);
    __gnu_cxx::
    __normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
    ::operator++((__normal_iterator<const_BamTools::SamReadGroup_*,_std::vector<BamTools::SamReadGroup,_std::allocator<BamTools::SamReadGroup>_>_>
                  *)&stack0xffffffffffffffe8);
  }
  return;
}

Assistant:

void SamReadGroupDictionary::Add(const SamReadGroupDictionary& readGroups)
{
    SamReadGroupConstIterator rgIter = readGroups.ConstBegin();
    SamReadGroupConstIterator rgEnd = readGroups.ConstEnd();
    for (; rgIter != rgEnd; ++rgIter)
        Add(*rgIter);
}